

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageInput.cpp
# Opt level: O2

ImageInput * __thiscall ImageInput::readImage(ImageInput *this,string *imagePath)

{
  pointer pcVar1;
  char cVar2;
  runtime_error *this_00;
  string *in_RDX;
  string local_40 [32];
  
  pcVar1 = imagePath[3]._M_dataplus._M_p;
  std::__cxx11::string::string(local_40,in_RDX);
  (*(code *)**(undefined8 **)pcVar1)(this,pcVar1,local_40);
  std::__cxx11::string::~string(local_40);
  cVar2 = cv::Mat::empty();
  if (cVar2 == '\0') {
    return this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Invalid File Path");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

cv::Mat ImageInput::readImage(std::string imagePath) {
  // get mat format of image from image reader
  cv::Mat cvImage = getReader()->read(imagePath);
  // check validity of image
  if (cvImage.empty()) {
    throw std::runtime_error("Invalid File Path");
  }
  return cvImage;
}